

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  BlockExprBase<(wabt::ExprType)8> *pBVar4;
  BlockExprBase<(wabt::ExprType)27> *pBVar5;
  IfExpr *pIVar6;
  TryExpr *pTVar7;
  TryTableExpr *pTVar8;
  Location local_f0;
  Location local_d0;
  Location local_b0;
  Location local_90;
  Location local_70;
  Location local_50;
  Enum local_2c;
  Expr *local_28;
  Expr *expr;
  LabelNode *label;
  BinaryReaderIR *this_local;
  
  label = (LabelNode *)this;
  sVar3 = std::
          vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
          ::size(&this->label_stack_);
  if (1 < sVar3) {
    local_2c = (Enum)TopLabelExpr(this,(LabelNode **)&expr,&local_28);
    bVar1 = Failed((Result)local_2c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    switch(*(undefined4 *)&expr->_vptr_Expr) {
    case 0:
    case 1:
    case 8:
      break;
    case 2:
      GetLocation(&local_50,this);
      pBVar4 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(local_28);
      (pBVar4->block).end_loc.filename._M_len = local_50.filename._M_len;
      (pBVar4->block).end_loc.filename._M_str = local_50.filename._M_str;
      (pBVar4->block).end_loc.field_1.field_1.offset = (size_t)local_50.field_1.field_1.offset;
      *(undefined8 *)((long)&(pBVar4->block).end_loc.field_1 + 8) = local_50.field_1._8_8_;
      break;
    case 3:
      GetLocation(&local_70,this);
      pBVar5 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(local_28);
      (pBVar5->block).end_loc.filename._M_len = local_70.filename._M_len;
      (pBVar5->block).end_loc.filename._M_str = local_70.filename._M_str;
      (pBVar5->block).end_loc.field_1.field_1.offset = (size_t)local_70.field_1.field_1.offset;
      *(undefined8 *)((long)&(pBVar5->block).end_loc.field_1 + 8) = local_70.field_1._8_8_;
      break;
    case 4:
      GetLocation(&local_90,this);
      pIVar6 = cast<wabt::IfExpr,wabt::Expr>(local_28);
      (pIVar6->true_).end_loc.filename._M_len = local_90.filename._M_len;
      (pIVar6->true_).end_loc.filename._M_str = local_90.filename._M_str;
      (pIVar6->true_).end_loc.field_1.field_1.offset = (size_t)local_90.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_90.field_1._8_8_;
      break;
    case 5:
      GetLocation(&local_b0,this);
      pIVar6 = cast<wabt::IfExpr,wabt::Expr>(local_28);
      (pIVar6->false_end_loc).filename._M_len = local_b0.filename._M_len;
      (pIVar6->false_end_loc).filename._M_str = local_b0.filename._M_str;
      (pIVar6->false_end_loc).field_1.field_1.offset = (size_t)local_b0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_b0.field_1._8_8_;
      break;
    case 6:
      GetLocation(&local_d0,this);
      pTVar7 = cast<wabt::TryExpr,wabt::Expr>(local_28);
      (pTVar7->block).end_loc.filename._M_len = local_d0.filename._M_len;
      (pTVar7->block).end_loc.filename._M_str = local_d0.filename._M_str;
      (pTVar7->block).end_loc.field_1.field_1.offset = (size_t)local_d0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pTVar7->block).end_loc.field_1 + 8) = local_d0.field_1._8_8_;
      break;
    case 7:
      GetLocation(&local_f0,this);
      pTVar8 = cast<wabt::TryTableExpr,wabt::Expr>(local_28);
      (pTVar8->block).end_loc.filename._M_len = local_f0.filename._M_len;
      (pTVar8->block).end_loc.filename._M_str = local_f0.filename._M_str;
      (pTVar8->block).end_loc.field_1.field_1.offset = (size_t)local_f0.field_1.field_1.offset;
      *(undefined8 *)((long)&(pTVar8->block).end_loc.field_1 + 8) = local_f0.field_1._8_8_;
    }
  }
  RVar2 = PopLabel(this);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::TryTable:
        cast<TryTableExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}